

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

void __thiscall dmlc::JSONWriter::WriteArraySeperator(JSONWriter *this)

{
  pointer puVar1;
  unsigned_long uVar2;
  
  puVar1 = (this->scope_counter_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar1[-1] == 0) {
    uVar2 = 1;
  }
  else {
    std::operator<<(this->os_,", ");
    puVar1 = (this->scope_counter_).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar2 = puVar1[-1] + 1;
  }
  puVar1[-1] = uVar2;
  WriteSeperator(this);
  return;
}

Assistant:

inline void JSONWriter::WriteArraySeperator() {
  if (scope_counter_.back() != 0) {
    Extend(os_, ", ");
  }
  scope_counter_.back() += 1;
  WriteSeperator();
}